

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::MixedContentModel::validateContentSpecial
          (MixedContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *param_7)

{
  NodeTypes NVar1;
  QName *pQVar2;
  QName *exemplar;
  bool bVar3;
  uint uriId;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  SubstitutionGroupComparator comparator;
  SubstitutionGroupComparator local_40;
  
  local_40.fGrammarResolver = pGrammarResolver;
  local_40.fStringPool = pStringPool;
  if (this->fOrdered == false) {
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < childCount; uVar5 = uVar5 + 1) {
      pQVar2 = children[uVar6];
      if (pQVar2->fURIId != 0xffffffff) {
        uVar7 = 0;
        while( true ) {
          uVar8 = (ulong)uVar7;
          uVar4 = this->fCount;
          if (uVar4 <= uVar8) break;
          if ((uint)this->fChildTypes[uVar8] < 9) {
            exemplar = this->fChildren[uVar8];
            switch(this->fChildTypes[uVar8]) {
            case Leaf:
              bVar3 = SubstitutionGroupComparator::isEquivalentTo(&local_40,pQVar2,exemplar);
              if (bVar3) {
                uVar4 = this->fCount;
                goto switchD_002e6b8d_caseD_6;
              }
              break;
            case Any:
              goto switchD_002e6b8d_caseD_6;
            case Any_Other:
              if ((pQVar2->fURIId != 1) && (pQVar2->fURIId != exemplar->fURIId))
              goto switchD_002e6b8d_caseD_6;
              break;
            case Any_NS:
              if (exemplar->fURIId == pQVar2->fURIId) goto switchD_002e6b8d_caseD_6;
            }
          }
          uVar7 = uVar7 + 1;
        }
switchD_002e6b8d_caseD_6:
        if (uVar4 == uVar8) goto LAB_002e6bdd;
      }
    }
  }
  else {
    uVar4 = 0;
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < childCount; uVar5 = uVar5 + 1) {
      uVar7 = children[uVar6]->fURIId;
      if (uVar7 != 0xffffffff) {
        NVar1 = this->fChildTypes[uVar4];
        pQVar2 = this->fChildren[uVar4];
        if (NVar1 == Any_NS) {
          if (pQVar2->fURIId != uVar7) {
LAB_002e6bdd:
            *indexFailingChild = uVar6;
            return false;
          }
        }
        else if (NVar1 == Any_Other) {
          if ((uVar7 == 1) || (uVar7 == pQVar2->fURIId)) goto LAB_002e6bdd;
        }
        else if ((NVar1 == Leaf) &&
                (bVar3 = SubstitutionGroupComparator::isEquivalentTo
                                   (&local_40,children[uVar6],pQVar2), !bVar3)) goto LAB_002e6bdd;
        uVar4 = (ulong)((int)uVar4 + 1);
      }
    }
  }
  return true;
}

Assistant:

bool MixedContentModel::validateContentSpecial(QName** const          children
                                            , XMLSize_t               childCount
                                            , unsigned int
                                            , GrammarResolver*  const pGrammarResolver
                                            , XMLStringPool*    const pStringPool
                                            , XMLSize_t*              indexFailingChild
                                            , MemoryManager*    const) const
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    // must match order
    if (fOrdered) {
        unsigned int inIndex = 0;
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {

            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
            QName* inChild = fChildren[inIndex];

            if (type == ContentSpecNode::Leaf) {
                if ( !comparator.isEquivalentTo(curChild, inChild))
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any) {
            }
            else if (type == ContentSpecNode::Any_NS) {
                if (inChild->getURI() != curChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any_Other)
            {
                // Here we assume that empty string has id 1.
                //
                unsigned int uriId = curChild->getURI();
                if (uriId == 1 || uriId == inChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }

            // advance index
            inIndex++;
        }
    }

    // can appear in any order
    else {
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            unsigned int inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
                QName* inChild = fChildren[inIndex];

                if (type == ContentSpecNode::Leaf) {
                    if ( comparator.isEquivalentTo(curChild, inChild))
                        break;
                }
                else if (type == ContentSpecNode::Any) {
                    break;
                }
                else if (type == ContentSpecNode::Any_NS) {
                    if (inChild->getURI() == curChild->getURI())
                        break;
                }
                else if (type == ContentSpecNode::Any_Other)
                {
                  // Here we assume that empty string has id 1.
                  //
                  unsigned int uriId = curChild->getURI();
                  if (uriId != 1 && uriId != inChild->getURI())
                    break;
                }

                // REVISIT: What about checking for multiple ANY matches?
                //          The content model ambiguity *could* be checked
                //          by the caller before constructing the mixed
                //          content model.
            }
            // We did not find this one, so the validation failed
            if (inIndex == fCount)
            {
                *indexFailingChild=outIndex;
                return false;
            }
        }
    }

    // Everything seems to be in order, so return success
    return true;
}